

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TextElementTable.h
# Opt level: O2

void __thiscall
psy::TextElementTable<psy::C::FloatingConstant>::rehash
          (TextElementTable<psy::C::FloatingConstant> *this)

{
  int iVar1;
  FloatingConstant *pFVar2;
  FloatingConstant **ppFVar3;
  ulong uVar4;
  FloatingConstant **ppFVar5;
  uint uVar6;
  long lVar7;
  
  free(this->buckets_);
  uVar6 = 4;
  if (this->bucketCount_ != 0) {
    uVar6 = this->bucketCount_ * 2;
  }
  this->bucketCount_ = uVar6;
  ppFVar5 = (FloatingConstant **)calloc((long)(int)uVar6,8);
  this->buckets_ = ppFVar5;
  ppFVar5 = this->elements_;
  iVar1 = this->count_;
  for (lVar7 = 0; (long)iVar1 * 8 + 8 != lVar7; lVar7 = lVar7 + 8) {
    pFVar2 = *(FloatingConstant **)((long)ppFVar5 + lVar7);
    uVar4 = (ulong)*(uint *)&(pFVar2->super_Lexeme).field_0x18 % (ulong)uVar6;
    ppFVar3 = this->buckets_;
    *(FloatingConstant **)&(pFVar2->super_Lexeme).field_0x20 = ppFVar3[uVar4];
    ppFVar3[uVar4] = pFVar2;
  }
  return;
}

Assistant:

void rehash()
    {
       if (buckets_)
           std::free(buckets_);

       if (!bucketCount_)
           bucketCount_ = 4;
       else
           bucketCount_ <<= 1;

       buckets_ = (ElemT**)std::calloc(bucketCount_, sizeof(ElemT*));

       ElemT** last = elements_ + (count_ + 1);
       for (ElemT** it = elements_; it != last; ++it) {
           ElemT* cur = *it;
           unsigned int h = cur->hashCode() % bucketCount_;
           cur->next_ = buckets_[h];
           buckets_[h] = cur;
       }
    }